

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.hpp
# Opt level: O0

void __thiscall uv::Loop::run(Loop *this)

{
  bool bVar1;
  Exception *this_00;
  error_code ec_00;
  undefined1 auStack_20 [8];
  error_code ec;
  Loop *this_local;
  
  ec._M_cat = (error_category *)this;
  std::error_code::error_code((error_code *)auStack_20);
  run(this,(error_code *)auStack_20);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_20);
  if (!bVar1) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x38);
  ec_00._0_8_ = (ulong)auStack_20 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  Exception::Exception(this_00,ec_00);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void Loop::run()
	{
		std::error_code ec;

		run(ec);
		if (ec) {
			throw uv::Exception(ec);
		}
	}